

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>_> __thiscall
wabt::MakeUnique<wabt::SimdShuffleOpExpr,wabt::Opcode&,v128&>(wabt *this,Opcode *args,v128 *args_1)

{
  Enum EVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)operator_new(0x50);
  EVar1 = args->enum_;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  *(undefined8 *)((long)puVar3 + 0x24) = 0;
  *(undefined8 *)((long)puVar3 + 0x2c) = 0;
  *(undefined4 *)(puVar3 + 7) = 0x2b;
  *puVar3 = &PTR__Expr_001b2ca0;
  *(Enum *)((long)puVar3 + 0x3c) = EVar1;
  uVar2 = *(undefined8 *)(args_1->v + 8);
  puVar3[8] = *(undefined8 *)args_1->v;
  puVar3[9] = uVar2;
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::SimdShuffleOpExpr,_std::default_delete<wabt::SimdShuffleOpExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}